

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall xmrig::Console::stop(Console *this)

{
  if (this->m_tty != (uv_tty_t *)0x0) {
    uv_tty_reset_mode();
    Handle::close<uv_tty_s*>(this->m_tty);
    this->m_tty = (uv_tty_t *)0x0;
  }
  return;
}

Assistant:

void xmrig::Console::stop()
{
    if (!m_tty) {
        return;
    }

    uv_tty_reset_mode();

    Handle::close(m_tty);
    m_tty = nullptr;
}